

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O1

void __thiscall
Assimp::SpatialSort::FindPositions
          (SpatialSort *this,aiVector3D *pPosition,ai_real pRadius,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *poResults)

{
  pointer *ppuVar1;
  float fVar2;
  float fVar3;
  pointer puVar4;
  pointer pEVar5;
  iterator __position;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ai_real *paVar11;
  uint uVar12;
  ulong uVar13;
  pointer pEVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar15 = pPosition->x;
  fVar18 = pPosition->y;
  fVar16 = (this->mPlaneNormal).y;
  fVar17 = (this->mPlaneNormal).x;
  fVar2 = pPosition->z;
  fVar3 = (this->mPlaneNormal).z;
  puVar4 = (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  pEVar14 = (this->mPositions).
            super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar5 = (this->mPositions).
           super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)pEVar5 - (long)pEVar14;
  if (lVar8 != 0) {
    fVar15 = fVar2 * fVar3 + fVar15 * fVar17 + fVar18 * fVar16;
    fVar18 = fVar15 + pRadius;
    if ((pEVar14->mDistance <= fVar18) &&
       (fVar15 = fVar15 - pRadius, paVar11 = &pEVar5[-1].mDistance,
       fVar15 < *paVar11 || fVar15 == *paVar11)) {
      uVar6 = (lVar8 >> 2) * -0x3333333333333333;
      uVar9 = uVar6 >> 1 & 0x7fffffff;
      if (7 < (uint)uVar6) {
        uVar13 = uVar6 >> 2 & 0x3fffffff;
        uVar10 = uVar9;
        do {
          uVar12 = (uint)uVar13;
          uVar7 = uVar12;
          if (fVar15 < pEVar14[uVar10].mDistance || fVar15 == pEVar14[uVar10].mDistance) {
            uVar7 = -uVar12;
          }
          uVar7 = uVar7 + (int)uVar10;
          uVar9 = (ulong)uVar7;
          uVar13 = uVar13 >> 1;
          uVar10 = (ulong)uVar7;
        } while (3 < uVar12);
      }
      uVar7 = (uint)uVar9;
      if (uVar7 != 0) {
        paVar11 = &pEVar14[uVar9].mDistance;
        do {
          uVar7 = (uint)uVar9;
          if (*paVar11 <= fVar15) goto LAB_003cbc6a;
          uVar9 = uVar9 - 1;
          paVar11 = paVar11 + -5;
        } while ((int)uVar9 != 0);
        uVar7 = 0;
      }
LAB_003cbc6a:
      do {
        uVar9 = (ulong)uVar7;
        if (uVar6 - 1 <= uVar9) break;
        uVar7 = uVar7 + 1;
      } while (pEVar14[uVar9].mDistance <= fVar15 && fVar15 != pEVar14[uVar9].mDistance);
      pEVar14 = pEVar14 + uVar9;
      do {
        if (fVar18 < pEVar14->mDistance || fVar18 == pEVar14->mDistance) {
          return;
        }
        fVar17 = (pEVar14->mPosition).x - pPosition->x;
        fVar15 = (pEVar14->mPosition).y - pPosition->y;
        fVar16 = (pEVar14->mPosition).z - pPosition->z;
        if (fVar16 * fVar16 + fVar17 * fVar17 + fVar15 * fVar15 < pRadius * pRadius) {
          __position._M_current =
               (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)poResults,__position,
                       &pEVar14->mIndex);
          }
          else {
            *__position._M_current = pEVar14->mIndex;
            ppuVar1 = &(poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
        }
        pEVar14 = pEVar14 + 1;
      } while (pEVar14 !=
               (this->mPositions).
               super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void SpatialSort::FindPositions( const aiVector3D& pPosition,
    ai_real pRadius, std::vector<unsigned int>& poResults) const
{
    const ai_real dist = pPosition * mPlaneNormal;
    const ai_real minDist = dist - pRadius, maxDist = dist + pRadius;

    // clear the array
    poResults.clear();

    // quick check for positions outside the range
    if( mPositions.size() == 0)
        return;
    if( maxDist < mPositions.front().mDistance)
        return;
    if( minDist > mPositions.back().mDistance)
        return;

    // do a binary search for the minimal distance to start the iteration there
    unsigned int index = (unsigned int)mPositions.size() / 2;
    unsigned int binaryStepSize = (unsigned int)mPositions.size() / 4;
    while( binaryStepSize > 1)
    {
        if( mPositions[index].mDistance < minDist)
            index += binaryStepSize;
        else
            index -= binaryStepSize;

        binaryStepSize /= 2;
    }

    // depending on the direction of the last step we need to single step a bit back or forth
    // to find the actual beginning element of the range
    while( index > 0 && mPositions[index].mDistance > minDist)
        index--;
    while( index < (mPositions.size() - 1) && mPositions[index].mDistance < minDist)
        index++;

    // Mow start iterating from there until the first position lays outside of the distance range.
    // Add all positions inside the distance range within the given radius to the result aray
    std::vector<Entry>::const_iterator it = mPositions.begin() + index;
    const ai_real pSquared = pRadius*pRadius;
    while( it->mDistance < maxDist)
    {
        if( (it->mPosition - pPosition).SquareLength() < pSquared)
            poResults.push_back( it->mIndex);
        ++it;
        if( it == mPositions.end())
            break;
    }

    // that's it
}